

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_19656::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,NullType *type)

{
  UnsupportedType *this_00;
  long *plVar1;
  size_type *psVar2;
  string local_60;
  undefined1 local_40 [32];
  
  this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
  Typelib::Type::getName_abi_cxx11_();
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x11821e);
  local_60._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_60._M_dataplus._M_p == psVar2) {
    local_60.field_2._M_allocated_capacity = *psVar2;
    local_60.field_2._8_8_ = plVar1[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar2;
  }
  local_60._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Typelib::UnsupportedType::UnsupportedType(this_00,(Type *)type,&local_60);
  __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,Typelib::UnsupportedType::~UnsupportedType
             );
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(NullType const& type)
    { throw UnsupportedType(type, "null types are not supported for export in IDL, found " + type.getName()); }